

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::updateDevex(HEkkPrimal *this)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer piVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  HighsInt to_entry;
  
  uVar12 = 0;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x4d,0);
  bVar8 = HSimplexNla::sparseLoopStyle
                    (&this->ekk_instance_->simplex_nla_,(this->col_aq).count,this->num_row,&to_entry
                    );
  piVar4 = (this->devex_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (ulong)(uint)to_entry;
  if (to_entry < 1) {
    uVar9 = uVar12;
  }
  dVar13 = 0.0;
  for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
    if (bVar8) {
      iVar11 = (this->col_aq).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12];
    }
    else {
      iVar11 = (int)uVar12;
    }
    dVar14 = (double)piVar4[(this->ekk_instance_->basis_).basicIndex_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar11]] * pdVar5[iVar11];
    dVar13 = dVar13 + dVar14 * dVar14;
  }
  iVar11 = this->variable_in;
  iVar2 = piVar4[iVar11];
  pdVar6 = (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((dVar13 + (double)iVar2) * 3.0 < pdVar6[iVar11]) {
    this->num_bad_devex_weight_ = this->num_bad_devex_weight_ + 1;
  }
  dVar14 = pdVar5[this->row_out];
  dVar13 = (dVar13 + (double)iVar2) / (dVar14 * dVar14);
  uVar3 = (this->row_ap).count;
  piVar7 = (this->row_ap).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->row_ap).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = 0;
  uVar9 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar9 = uVar12;
  }
  for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
    iVar2 = piVar7[uVar12];
    dVar14 = pdVar5[iVar2];
    dVar14 = (double)piVar4[iVar2] + dVar13 * dVar14 * dVar14;
    if (pdVar6[iVar2] <= dVar14 && dVar14 != pdVar6[iVar2]) {
      pdVar6[iVar2] = dVar14;
    }
  }
  uVar3 = (this->row_ep).count;
  piVar7 = (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = this->num_col;
  pdVar5 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = 0;
  uVar9 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar9 = uVar12;
  }
  for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
    lVar10 = (long)piVar7[uVar12];
    lVar1 = iVar2 + lVar10;
    dVar14 = pdVar5[lVar10];
    dVar14 = (double)piVar4[lVar1] + dVar13 * dVar14 * dVar14;
    if (pdVar6[lVar1] <= dVar14 && dVar14 != pdVar6[lVar1]) {
      pdVar6[lVar1] = dVar14;
    }
  }
  if (dVar13 <= 1.0) {
    dVar13 = 1.0;
  }
  pdVar6[this->variable_out] = dVar13;
  pdVar6[iVar11] = 1.0;
  this->num_devex_iterations_ = this->num_devex_iterations_ + 1;
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x4d,0);
  return;
}

Assistant:

void HEkkPrimal::updateDevex() {
  analysis->simplexTimerStart(DevexUpdateWeightClock);
  // Compute the pivot weight from the reference set
  double dPivotWeight = 0.0;
  HighsInt to_entry;
  const bool use_col_indices = ekk_instance_.simplex_nla_.sparseLoopStyle(
      col_aq.count, num_row, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iRow = use_col_indices ? col_aq.index[iEntry] : iEntry;
    HighsInt iCol = ekk_instance_.basis_.basicIndex_[iRow];
    double dAlpha = devex_index_[iCol] * col_aq.array[iRow];
    dPivotWeight += dAlpha * dAlpha;
  }
  dPivotWeight += devex_index_[variable_in] * 1.0;

  // Check if the saved weight is too large
  if (edge_weight_[variable_in] > kBadDevexWeightFactor * dPivotWeight)
    num_bad_devex_weight_++;

  // Update the devex weight for all
  double dPivot = col_aq.array[row_out];
  dPivotWeight /= (dPivot * dPivot);

  for (HighsInt iEl = 0; iEl < row_ap.count; iEl++) {
    HighsInt iCol = row_ap.index[iEl];
    double alpha = row_ap.array[iCol];
    double devex = dPivotWeight * alpha * alpha;
    devex += devex_index_[iCol] * 1.0;
    if (edge_weight_[iCol] < devex) {
      edge_weight_[iCol] = devex;
    }
  }
  for (HighsInt iEl = 0; iEl < row_ep.count; iEl++) {
    HighsInt iRow = row_ep.index[iEl];
    HighsInt iCol = iRow + num_col;
    double alpha = row_ep.array[iRow];
    double devex = dPivotWeight * alpha * alpha;
    devex += devex_index_[iCol] * 1.0;
    if (edge_weight_[iCol] < devex) {
      edge_weight_[iCol] = devex;
    }
  }
  // Update devex weight for the pivots
  edge_weight_[variable_out] = max(1.0, dPivotWeight);
  edge_weight_[variable_in] = 1.0;
  num_devex_iterations_++;
  analysis->simplexTimerStop(DevexUpdateWeightClock);
}